

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CopyBroadcastReceiver.h
# Opt level: O2

int __thiscall
aeron::concurrent::broadcast::CopyBroadcastReceiver::receive
          (CopyBroadcastReceiver *this,handler_t *handler)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int32_t __val;
  int32_t __args;
  IllegalArgumentException *this_00;
  IllegalStateException *pIVar4;
  char *pcVar5;
  allocator local_10a;
  allocator local_109;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  lVar1 = (this->m_receiver->m_lappedCount).super___atomic_base<long>._M_i;
  bVar2 = BroadcastReceiver::receiveNext(this->m_receiver);
  iVar3 = 0;
  if (bVar2) {
    if (lVar1 != (this->m_receiver->m_lappedCount).super___atomic_base<long>._M_i) {
      this_00 = (IllegalArgumentException *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_c8,"unable to keep up with broadcast buffer",
                 (allocator *)&local_68);
      std::__cxx11::string::string
                ((string *)&local_e8,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,(allocator *)&local_88);
      pcVar5 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::__cxx11::string::string((string *)&local_108,pcVar5,(allocator *)&local_a8);
      util::IllegalArgumentException::IllegalArgumentException
                (this_00,&local_c8,&local_e8,&local_108,0x35);
      __cxa_throw(this_00,&util::IllegalArgumentException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    __val = BroadcastReceiver::length(this->m_receiver);
    if ((int)(this->m_scratchBuffer).m_length < __val) {
      pIVar4 = (IllegalStateException *)__cxa_allocate_exception(0x48);
      std::__cxx11::to_string(&local_68,__val);
      std::operator+(&local_108,"buffer required size ",&local_68);
      std::operator+(&local_e8,&local_108," but only has ");
      std::__cxx11::to_string(&local_88,(this->m_scratchBuffer).m_length);
      std::operator+(&local_c8,&local_e8,&local_88);
      std::__cxx11::string::string
                ((string *)&local_a8,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,&local_109);
      pcVar5 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::__cxx11::string::string((string *)&local_48,pcVar5,&local_10a);
      util::IllegalStateException::IllegalStateException(pIVar4,&local_c8,&local_a8,&local_48,0x3d);
      __cxa_throw(pIVar4,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    __args = BroadcastReceiver::typeId(this->m_receiver);
    AtomicBuffer::putBytes
              (&this->m_scratchBuffer,0,this->m_receiver->m_buffer,
               this->m_receiver->m_recordOffset + 8,__val);
    bVar2 = BroadcastReceiver::validate(this->m_receiver);
    if (!bVar2) {
      pIVar4 = (IllegalStateException *)__cxa_allocate_exception(0x48);
      std::__cxx11::string::string
                ((string *)&local_c8,"unable to keep up with broadcast buffer",
                 (allocator *)&local_68);
      std::__cxx11::string::string
                ((string *)&local_e8,
                 "int aeron::concurrent::broadcast::CopyBroadcastReceiver::receive(const handler_t &)"
                 ,(allocator *)&local_88);
      pcVar5 = util::past_prefix("/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client"
                                 ,
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/fairtide[P]aeron-archive-client/build_O2/deps/aeron/src/aeron_project/aeron-client/src/main/cpp/concurrent/broadcast/CopyBroadcastReceiver.h"
                                );
      std::__cxx11::string::string((string *)&local_108,pcVar5,(allocator *)&local_a8);
      util::IllegalStateException::IllegalStateException(pIVar4,&local_c8,&local_e8,&local_108,0x45)
      ;
      __cxa_throw(pIVar4,&util::IllegalStateException::typeinfo,
                  util::SourcedException::~SourcedException);
    }
    std::function<void_(int,_aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
              (handler,__args,&this->m_scratchBuffer,0,__val);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int receive(const handler_t& handler)
    {
        int messagesReceived = 0;
        const long lastSeenLappedCount = m_receiver.lappedCount();

        if (m_receiver.receiveNext())
        {
            if (lastSeenLappedCount != m_receiver.lappedCount())
            {
                throw util::IllegalArgumentException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            const std::int32_t length = m_receiver.length();
            if (length > m_scratchBuffer.capacity())
            {
                throw util::IllegalStateException(
                    "buffer required size " + std::to_string(length) +
                    " but only has " + std::to_string(m_scratchBuffer.capacity()), SOURCEINFO);
            }

            const std::int32_t msgTypeId = m_receiver.typeId();
            m_scratchBuffer.putBytes(0, m_receiver.buffer(), m_receiver.offset(), length);

            if (!m_receiver.validate())
            {
                throw util::IllegalStateException("unable to keep up with broadcast buffer", SOURCEINFO);
            }

            handler(msgTypeId, m_scratchBuffer, 0, length);

            messagesReceived = 1;
        }

        return messagesReceived;
    }